

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O0

void ConvertBGRAToRGBA4444_SSE2(uint32_t *src,int num_pixels,uint8_t *dst)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint8_t *in_RDX;
  int in_ESI;
  uint32_t *in_RDI;
  ulong uVar3;
  ulong uVar4;
  __m128i rgba;
  __m128i rgba1;
  __m128i rgba0;
  __m128i ga2;
  __m128i rb1;
  __m128i ga1;
  __m128i rb0;
  __m128i ga0;
  __m128i v2h;
  __m128i v2l;
  __m128i v1h;
  __m128i v1l;
  __m128i v0h;
  __m128i v0l;
  __m128i bgra4;
  __m128i bgra0;
  __m128i *out;
  __m128i *in;
  __m128i mask_0xf0;
  __m128i mask_0x0f;
  undefined8 local_308;
  uint8_t *local_278;
  uint32_t *local_270;
  int local_234;
  undefined1 local_228;
  undefined1 uStack_227;
  undefined1 uStack_226;
  undefined1 uStack_225;
  undefined1 uStack_224;
  undefined1 uStack_223;
  undefined1 uStack_222;
  undefined1 uStack_221;
  undefined1 local_218;
  undefined1 uStack_217;
  undefined1 uStack_216;
  undefined1 uStack_215;
  undefined1 uStack_214;
  undefined1 uStack_213;
  undefined1 uStack_212;
  undefined1 uStack_211;
  undefined1 local_1c8;
  undefined1 uStack_1c7;
  undefined1 uStack_1c5;
  undefined1 uStack_1c4;
  undefined1 uStack_1c3;
  undefined1 uStack_1c1;
  undefined1 local_1b8;
  undefined1 uStack_1b4;
  ushort local_198;
  ushort uStack_196;
  ushort uStack_194;
  ushort uStack_192;
  ushort uStack_190;
  ushort uStack_18e;
  ushort uStack_18a;
  undefined1 uStack_60;
  undefined1 uStack_5f;
  undefined1 uStack_5d;
  undefined1 uStack_5c;
  undefined1 uStack_5b;
  undefined1 uStack_59;
  undefined1 uStack_50;
  undefined1 uStack_4c;
  undefined4 uStack_40;
  undefined4 uStack_30;
  
  local_278 = in_RDX;
  local_270 = in_RDI;
  for (local_234 = in_ESI; 7 < local_234; local_234 = local_234 + -8) {
    uVar1 = *(undefined8 *)(local_270 + 4);
    uVar2 = *(undefined8 *)(local_270 + 6);
    local_1b8 = (undefined1)*(undefined8 *)local_270;
    uStack_1b4 = (undefined1)((ulong)*(undefined8 *)local_270 >> 0x20);
    local_1c8 = (undefined1)uVar1;
    uStack_1c7 = (undefined1)((ulong)uVar1 >> 8);
    uStack_1c5 = (undefined1)((ulong)uVar1 >> 0x18);
    uStack_1c4 = (undefined1)((ulong)uVar1 >> 0x20);
    uStack_1c3 = (undefined1)((ulong)uVar1 >> 0x28);
    uStack_1c1 = (undefined1)((ulong)uVar1 >> 0x38);
    uStack_50 = (undefined1)*(undefined8 *)(local_270 + 2);
    uStack_4c = (undefined1)((ulong)*(undefined8 *)(local_270 + 2) >> 0x20);
    uStack_60 = (undefined1)uVar2;
    uStack_5f = (undefined1)((ulong)uVar2 >> 8);
    uStack_5d = (undefined1)((ulong)uVar2 >> 0x18);
    uStack_5c = (undefined1)((ulong)uVar2 >> 0x20);
    uStack_5b = (undefined1)((ulong)uVar2 >> 0x28);
    uStack_59 = (undefined1)((ulong)uVar2 >> 0x38);
    local_198 = (ushort)local_308;
    uStack_196 = (ushort)((ulong)local_308 >> 0x10);
    uStack_194 = (ushort)((ulong)local_308 >> 0x20);
    uStack_190 = (ushort)uStack_30;
    uVar3 = CONCAT26((ushort)((ulong)local_308 >> 0x34),
                     CONCAT24(uStack_194 >> 4,CONCAT22(uStack_196 >> 4,local_198 >> 4))) &
            0xf0f0f0f0f0f0f0f |
            CONCAT17(uStack_59,
                     CONCAT16(uStack_5d,CONCAT15(uStack_1c1,CONCAT14(uStack_1c5,uStack_40)))) &
            0xf0f0f0f0f0f0f0f0;
    uVar4 = CONCAT26((ushort)(CONCAT13(uStack_5b,CONCAT12(uStack_5f,CONCAT11(uStack_1c3,uStack_1c7))
                                      ) >> 0x14),
                     CONCAT24(CONCAT11(uStack_1c3,uStack_1c7) >> 4,
                              CONCAT22((ushort)((uint)uStack_30 >> 0x14),uStack_190 >> 4))) &
            0xf0f0f0f0f0f0f0f |
            CONCAT17(uStack_5c,
                     CONCAT16(uStack_60,
                              CONCAT15(uStack_1c4,
                                       CONCAT14(local_1c8,
                                                CONCAT13(uStack_4c,
                                                         CONCAT12(uStack_50,
                                                                  CONCAT11(uStack_1b4,local_1b8)))))
                             )) & 0xf0f0f0f0f0f0f0f0;
    local_218 = (undefined1)uVar3;
    uStack_217 = (undefined1)(uVar3 >> 8);
    uStack_216 = (undefined1)(uVar3 >> 0x10);
    uStack_215 = (undefined1)(uVar3 >> 0x18);
    uStack_214 = (undefined1)(uVar3 >> 0x20);
    uStack_213 = (undefined1)(uVar3 >> 0x28);
    uStack_212 = (undefined1)(uVar3 >> 0x30);
    uStack_211 = (undefined1)(uVar3 >> 0x38);
    local_228 = (undefined1)uVar4;
    uStack_227 = (undefined1)(uVar4 >> 8);
    uStack_226 = (undefined1)(uVar4 >> 0x10);
    uStack_225 = (undefined1)(uVar4 >> 0x18);
    uStack_224 = (undefined1)(uVar4 >> 0x20);
    uStack_223 = (undefined1)(uVar4 >> 0x28);
    uStack_222 = (undefined1)(uVar4 >> 0x30);
    uStack_221 = (undefined1)(uVar4 >> 0x38);
    *(ulong *)local_278 =
         CONCAT17(uStack_225,
                  CONCAT16(uStack_215,
                           CONCAT15(uStack_226,
                                    CONCAT14(uStack_216,
                                             CONCAT13(uStack_227,
                                                      CONCAT12(uStack_217,
                                                               CONCAT11(local_228,local_218)))))));
    *(ulong *)(local_278 + 8) =
         CONCAT17(uStack_221,
                  CONCAT16(uStack_211,
                           CONCAT15(uStack_222,
                                    CONCAT14(uStack_212,
                                             CONCAT13(uStack_223,
                                                      CONCAT12(uStack_213,
                                                               CONCAT11(uStack_224,uStack_214)))))))
    ;
    local_278 = local_278 + 0x10;
    local_270 = local_270 + 8;
  }
  if (0 < local_234) {
    VP8LConvertBGRAToRGBA4444_C(local_270,local_234,local_278);
  }
  return;
}

Assistant:

static void ConvertBGRAToRGBA4444_SSE2(const uint32_t* WEBP_RESTRICT src,
                                       int num_pixels,
                                       uint8_t* WEBP_RESTRICT dst) {
  const __m128i mask_0x0f = _mm_set1_epi8(0x0f);
  const __m128i mask_0xf0 = _mm_set1_epi8((char)0xf0);
  const __m128i* in = (const __m128i*)src;
  __m128i* out = (__m128i*)dst;
  while (num_pixels >= 8) {
    const __m128i bgra0 = _mm_loadu_si128(in++);     // bgra0|bgra1|bgra2|bgra3
    const __m128i bgra4 = _mm_loadu_si128(in++);     // bgra4|bgra5|bgra6|bgra7
    const __m128i v0l = _mm_unpacklo_epi8(bgra0, bgra4);  // b0b4g0g4r0r4a0a4...
    const __m128i v0h = _mm_unpackhi_epi8(bgra0, bgra4);  // b2b6g2g6r2r6a2a6...
    const __m128i v1l = _mm_unpacklo_epi8(v0l, v0h);    // b0b2b4b6g0g2g4g6...
    const __m128i v1h = _mm_unpackhi_epi8(v0l, v0h);    // b1b3b5b7g1g3g5g7...
    const __m128i v2l = _mm_unpacklo_epi8(v1l, v1h);    // b0...b7 | g0...g7
    const __m128i v2h = _mm_unpackhi_epi8(v1l, v1h);    // r0...r7 | a0...a7
    const __m128i ga0 = _mm_unpackhi_epi64(v2l, v2h);   // g0...g7 | a0...a7
    const __m128i rb0 = _mm_unpacklo_epi64(v2h, v2l);   // r0...r7 | b0...b7
    const __m128i ga1 = _mm_srli_epi16(ga0, 4);         // g0-|g1-|...|a6-|a7-
    const __m128i rb1 = _mm_and_si128(rb0, mask_0xf0);  // -r0|-r1|...|-b6|-a7
    const __m128i ga2 = _mm_and_si128(ga1, mask_0x0f);  // g0-|g1-|...|a6-|a7-
    const __m128i rgba0 = _mm_or_si128(ga2, rb1);       // rg0..rg7 | ba0..ba7
    const __m128i rgba1 = _mm_srli_si128(rgba0, 8);     // ba0..ba7 | 0
#if (WEBP_SWAP_16BIT_CSP == 1)
    const __m128i rgba = _mm_unpacklo_epi8(rgba1, rgba0);  // barg0...barg7
#else
    const __m128i rgba = _mm_unpacklo_epi8(rgba0, rgba1);  // rgba0...rgba7
#endif
    _mm_storeu_si128(out++, rgba);
    num_pixels -= 8;
  }
  // left-overs
  if (num_pixels > 0) {
    VP8LConvertBGRAToRGBA4444_C((const uint32_t*)in, num_pixels, (uint8_t*)out);
  }
}